

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O3

void __thiscall rsg::Function::Function(Function *this,char *name)

{
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name,&local_11);
  (this->m_parameters).super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_returnType).m_baseType = TYPE_VOID;
  (this->m_returnType).m_precision = PRECISION_NONE;
  (this->m_parameters).super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_parameters).super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_returnType).m_typeName._M_dataplus._M_p =
       (pointer)&(this->m_returnType).m_typeName.field_2;
  (this->m_returnType).m_typeName._M_string_length = 0;
  (this->m_returnType).m_typeName.field_2._M_local_buf[0] = '\0';
  (this->m_returnType).m_numElements = 0;
  (this->m_returnType).m_elementType = (VariableType *)0x0;
  (this->m_returnType).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_returnType).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_returnType).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BlockStatement::BlockStatement(&this->m_functionBlock);
  return;
}

Assistant:

Function::Function (const char* name)
	: m_name(name)
{
}